

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_hook.h
# Opt level: O0

bool __thiscall
absl::lts_20250127::base_internal::AtomicHook<void_(*)(const_void_*,_long)>::DoStore
          (AtomicHook<void_(*)(const_void_*,_long)> *this,FnPtr fn)

{
  bool local_31;
  bool same_value_already_stored;
  FnPtr p_Stack_20;
  bool store_succeeded;
  FnPtr expected;
  FnPtr fn_local;
  AtomicHook<void_(*)(const_void_*,_long)> *this_local;
  
  expected = fn;
  fn_local = (FnPtr)this;
  if (fn != (FnPtr)0x0) {
    p_Stack_20 = this->default_fn_;
    local_31 = std::atomic<void_(*)(const_void_*,_long)>::compare_exchange_strong
                         (&this->hook_,&stack0xffffffffffffffe0,fn,memory_order_acq_rel,
                          memory_order_acquire);
    local_31 = local_31 || p_Stack_20 == expected;
    return local_31;
  }
  __assert_fail("fn",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/base/internal/atomic_hook.h"
                ,0x99,
                "bool absl::base_internal::AtomicHook<void (*)(const void *, long)>::DoStore(FnPtr) [T = void (*)(const void *, long)]"
               );
}

Assistant:

bool DoStore(FnPtr fn) {
    assert(fn);
    FnPtr expected = default_fn_;
    const bool store_succeeded = hook_.compare_exchange_strong(
        expected, fn, std::memory_order_acq_rel, std::memory_order_acquire);
    const bool same_value_already_stored = (expected == fn);
    return store_succeeded || same_value_already_stored;
  }